

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::
get_match_positions_basename_word_prefix
          (Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns)

{
  bool bVar1;
  pointer pcVar2;
  char *pcVar3;
  unsigned_long uVar4;
  pointer p_Var5;
  char *pcVar6;
  bool *pbVar7;
  char *pcVar8;
  unsigned_long local_38;
  
  pcVar8 = (this->item_basename_)._M_current;
  pcVar2 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar6 = (this->qit_basename_)._M_current;
  p_Var5 = (this->qit_basename_words_).
           super__Vector_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = &(this->props_).
            super__Vector_base<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::NonPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)pcVar8 - (long)pcVar2].word_start;
  uVar4 = (long)pcVar8 - (long)pcVar2;
  for (; pcVar8 != pcVar3; pcVar8 = pcVar8 + 1) {
    bVar1 = *pbVar7;
    if ((pcVar6 != p_Var5[bVar1]._M_current) && (*pcVar8 == *pcVar6)) {
      pcVar6 = pcVar6 + 1;
      local_38 = uVar4;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (posns,&local_38);
    }
    p_Var5 = p_Var5 + bVar1;
    pbVar7 = pbVar7 + 3;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void get_match_positions_basename_word_prefix(
      std::vector<std::size_t>& posns) const {
    auto item_it = item_basename_;
    auto const item_first = item_.cbegin();
    auto const item_last = item_.cend();
    auto props_it = props_.cbegin() + (item_basename_ - item_.cbegin());
    auto query_it = qit_basename_;
    auto query_last_it = qit_basename_words_.cbegin();

    while (item_it != item_last) {
      if (props_it->word_start) {
        ++query_last_it;
      }
      if (query_it != *query_last_it && *item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
      ++props_it;
    }
  }